

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall
BasePort::ReadBlock(BasePort *this,uchar boardId,nodeaddr_t addr,quadlet_t *rdata,uint nbytes)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  byte bVar5;
  long lVar6;
  char *pcVar7;
  
  if (nbytes == 0) {
    poVar4 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"BasePort::ReadBlock: illegal size (",0x23);
  }
  else {
    if (nbytes == 4) {
      iVar2 = (*this->_vptr_BasePort[0x23])(this,boardId,addr,rdata);
      return SUB41(iVar2,0);
    }
    if ((nbytes & 3) == 0) {
      uVar3 = (*this->_vptr_BasePort[0x19])(this);
      if (nbytes <= uVar3) {
        bVar5 = boardId & 0x3f;
        if (bVar5 < 0x10) {
          uVar1 = this->Board2Node[bVar5];
          if (0x3f < uVar1) {
            return false;
          }
        }
        else {
          uVar1 = 0x3f;
          if (bVar5 != 0x3f) {
            return false;
          }
        }
        iVar2 = (*this->_vptr_BasePort[7])
                          (this,(ulong)uVar1,addr,rdata,nbytes,(ulong)(boardId & 0xc0));
        return SUB41(iVar2,0);
      }
      poVar4 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"BasePort::ReadBlock: packet size ",0x21);
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," too large (max = ",0x12);
      (*this->_vptr_BasePort[0x19])(this);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar7 = " bytes)";
      lVar6 = 7;
      goto LAB_0010b93b;
    }
    poVar4 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"BasePort::ReadBlock: illegal size (",0x23);
  }
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  pcVar7 = "), must be multiple of 4";
  lVar6 = 0x18;
LAB_0010b93b:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

bool BasePort::ReadBlock(unsigned char boardId, nodeaddr_t addr, quadlet_t *rdata,
                             unsigned int nbytes)
{
    if (nbytes == 4)
        return ReadQuadlet(boardId, addr, *rdata);
    else if ((nbytes == 0) || ((nbytes%4) != 0)) {
        outStr << "BasePort::ReadBlock: illegal size (" << nbytes << "), must be multiple of 4" << std::endl;
        return false;
    }
    else if (nbytes > GetMaxReadDataSize()) {
        outStr << "BasePort::ReadBlock: packet size " << std::dec << nbytes << " too large (max = "
               << GetMaxReadDataSize() << " bytes)" << std::endl;
        return false;
    }

    nodeid_t node = ConvertBoardToNode(boardId);
    return (node < MAX_NODES) ? ReadBlockNode(node, addr, rdata, nbytes, boardId&FW_NODE_FLAGS_MASK) : false;
}